

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

UBool __thiscall icu_63::Formattable::operator==(Formattable *this,Formattable *that)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *this_00;
  UnicodeString *text;
  UBool UVar3;
  int32_t iVar4;
  int32_t len;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  bVar7 = true;
  if (this == that) {
    return '\x01';
  }
  if (this->fType != that->fType) goto LAB_0020d1e5;
  switch(this->fType) {
  case kDate:
  case kDouble:
    bVar7 = (bool)(-((that->fValue).fDouble == (this->fValue).fDouble) & 1);
    break;
  case kLong:
  case kInt64:
    bVar7 = (this->fValue).fObject == (that->fValue).fObject;
    break;
  case kString:
    this_00 = (this->fValue).fString;
    text = (that->fValue).fString;
    uVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (this_00->fUnion).fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      bVar7 = false;
      if ((((int)sVar2 & 1U) == 0) && (len == iVar4)) {
        UVar3 = UnicodeString::doEquals(this_00,text,len);
        bVar7 = UVar3 != '\0';
      }
    }
    else {
      bVar7 = (bool)(*(byte *)&text->fUnion & 1);
    }
    break;
  case kArray:
    if ((this->fValue).fArrayAndCount.fCount == (that->fValue).fArrayAndCount.fCount) {
      if ((this->fValue).fArrayAndCount.fCount < 1) {
        return '\x01';
      }
      lVar5 = 0;
      lVar6 = 0;
      while (UVar3 = operator==((Formattable *)
                                ((long)&((this->fValue).fObject)->_vptr_UObject + lVar5),
                                (Formattable *)
                                ((long)&((that->fValue).fObject)->_vptr_UObject + lVar5)),
            UVar3 != '\0') {
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x70;
        if ((this->fValue).fArrayAndCount.fCount <= lVar6) {
          return '\x01';
        }
      }
    }
    goto LAB_0020d1e5;
  case kObject:
    if (((Measure *)(this->fValue).fObject != (Measure *)0x0) &&
       ((that->fValue).fObject != (UObject *)0x0)) {
      UVar3 = Measure::operator==((Measure *)(this->fValue).fObject,(that->fValue).fObject);
      return UVar3;
    }
LAB_0020d1e5:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

UBool
Formattable::operator==(const Formattable& that) const
{
    int32_t i;

    if (this == &that) return TRUE;

    // Returns FALSE if the data types are different.
    if (fType != that.fType) return FALSE;

    // Compares the actual data values.
    UBool equal = TRUE;
    switch (fType) {
    case kDate:
        equal = (fValue.fDate == that.fValue.fDate);
        break;
    case kDouble:
        equal = (fValue.fDouble == that.fValue.fDouble);
        break;
    case kLong:
    case kInt64:
        equal = (fValue.fInt64 == that.fValue.fInt64);
        break;
    case kString:
        equal = (*(fValue.fString) == *(that.fValue.fString));
        break;
    case kArray:
        if (fValue.fArrayAndCount.fCount != that.fValue.fArrayAndCount.fCount) {
            equal = FALSE;
            break;
        }
        // Checks each element for equality.
        for (i=0; i<fValue.fArrayAndCount.fCount; ++i) {
            if (fValue.fArrayAndCount.fArray[i] != that.fValue.fArrayAndCount.fArray[i]) {
                equal = FALSE;
                break;
            }
        }
        break;
    case kObject:
        if (fValue.fObject == NULL || that.fValue.fObject == NULL) {
            equal = FALSE;
        } else {
            equal = objectEquals(fValue.fObject, that.fValue.fObject);
        }
        break;
    }

    // TODO:  compare digit lists if numeric.
    return equal;
}